

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

void __thiscall Container::prepare_root(Container *this)

{
  path *__lhs;
  path *work_dir;
  pointer pcVar1;
  int iVar2;
  ContextManager *pCVar3;
  error_code error;
  path proc_dir;
  path local_b8;
  error_code local_90;
  path local_80;
  path local_58;
  
  iVar2 = mount("none","/","none",0x44000,(void *)0x0);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_80._M_pathname,"Cannot privatize mounts: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_pathname._M_dataplus._M_p != &local_80._M_pathname.field_2) {
      operator_delete(local_80._M_pathname._M_dataplus._M_p,
                      local_80._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  local_90._M_value = 0;
  local_90._M_cat = (error_category *)std::_V2::system_category();
  __lhs = &this->root_;
  std::filesystem::create_directories(__lhs,&local_90);
  if (local_90._M_value != 0) {
    pCVar3 = ContextManager::get();
    pcVar1 = (__lhs->_M_pathname)._M_dataplus._M_p;
    (**(code **)(*(long *)local_90._M_cat + 0x20))(&local_b8,local_90._M_cat,local_90._M_value);
    format_abi_cxx11_(&local_80._M_pathname,"Cannot create root directory (%s): %s",pcVar1);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_pathname._M_dataplus._M_p != &local_80._M_pathname.field_2) {
      operator_delete(local_80._M_pathname._M_dataplus._M_p,
                      local_80._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = mount("none",(__lhs->_M_pathname)._M_dataplus._M_p,"tmpfs",0,"mode=755,size=1g");
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_80._M_pathname,"Cannot mount root tmpfs: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_pathname._M_dataplus._M_p != &local_80._M_pathname.field_2) {
      operator_delete(local_80._M_pathname._M_dataplus._M_p,
                      local_80._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = mount("none",(__lhs->_M_pathname)._M_dataplus._M_p,"tmpfs",0x20,"mode=755,size=1g");
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_80._M_pathname,"Cannot remount root tmpfs: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_pathname._M_dataplus._M_p != &local_80._M_pathname.field_2) {
      operator_delete(local_80._M_pathname._M_dataplus._M_p,
                      local_80._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_b8,(char (*) [5])"proc",auto_format);
  std::filesystem::__cxx11::operator/(&local_80,__lhs,&local_b8);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::create_directories(&local_80,&local_90);
  if (local_90._M_value != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create \'/proc\' dir: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = mount("none",local_80._M_pathname._M_dataplus._M_p,"proc",0,"");
  if (iVar2 < 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot mount proc filesystem: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = mount("none",local_80._M_pathname._M_dataplus._M_p,"proc",0x20,"hidepid=2");
  if (iVar2 < 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot remount proc filesystem: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_58,(char (*) [5])"work",auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_58);
  work_dir = &this->work_dir_;
  if (&local_b8 != work_dir) {
    prepare_root();
  }
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::create_directories(work_dir,&local_90);
  if (local_90._M_value != 0) {
    pCVar3 = ContextManager::get();
    (**(code **)(*(long *)local_90._M_cat + 0x20))(&local_58,local_90._M_cat,local_90._M_value);
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create \'/work\' dir: %s",
                      local_58._M_pathname._M_dataplus._M_p);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_pathname._M_dataplus._M_p != &local_58._M_pathname.field_2) {
      operator_delete(local_58._M_pathname._M_dataplus._M_p,
                      local_58._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_58,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_58);
  std::filesystem::create_directories(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_58);
  if (local_90._M_value != 0) {
    pCVar3 = ContextManager::get();
    (**(code **)(*(long *)local_90._M_cat + 0x20))(&local_58,local_90._M_cat,local_90._M_value);
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create \'/tmp\' dir: %s",
                      local_58._M_pathname._M_dataplus._M_p);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_pathname._M_dataplus._M_p != &local_58._M_pathname.field_2) {
      operator_delete(local_58._M_pathname._M_dataplus._M_p,
                      local_58._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_58,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_58);
  iVar2 = chmod(local_b8._M_pathname._M_dataplus._M_p,0x1ff);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_58);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot chmod() \'/tmp\': %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->task_data_).ptr_)->use_standard_binds == true) {
    Bind::apply_standard_rules(__lhs,work_dir);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  return;
}

Assistant:

void Container::prepare_root() {
    if (mount("none", "/", "none", MS_REC | MS_PRIVATE, nullptr) != 0) {
        die(format("Cannot privatize mounts: %m"));
    }

    std::error_code error;
    fs::create_directories(root_, error);
    if (error) {
        die(format("Cannot create root directory (%s): %s", root_.c_str(), error.message().c_str()));
    }

    if (mount("none", root_.c_str(), "tmpfs", 0, "mode=755,size=1g") != 0) {
        die(format("Cannot mount root tmpfs: %m"));
    }
    if (mount("none", root_.c_str(), "tmpfs", MS_REMOUNT, "mode=755,size=1g") != 0) {
        die(format("Cannot remount root tmpfs: %m"));
    }

    fs::path proc_dir = root_ / "proc";
    fs::create_directories(proc_dir, error);
    if (error) {
        die(format("Cannot create '/proc' dir: %m"));
    }
    if (mount("none", proc_dir.c_str(), "proc", 0, "") < 0) {
        die(format("Cannot mount proc filesystem: %m"));
    }
    if (mount("none", proc_dir.c_str(), "proc", MS_REMOUNT, "hidepid=2") < 0) {
        die(format("Cannot remount proc filesystem: %m"));
    }

    work_dir_ = root_ / "work";
    fs::create_directories(work_dir_, error);
    if (error) {
        die(format("Cannot create '/work' dir: %s", error.message().c_str()));
    }

    fs::create_directories(root_ / "tmp");
    if (error) {
        die(format("Cannot create '/tmp' dir: %s", error.message().c_str()));
    }
    if (chmod((root_ / "tmp").c_str(), 0777) != 0) {
        die(format("Cannot chmod() '/tmp': %m"));
    }

    if (task_data_->use_standard_binds) {
        Bind::apply_standard_rules(root_, work_dir_);
    }
}